

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# removed_api.cpp
# Opt level: O0

void __thiscall
QFutureInterfaceBase::setContinuation
          (QFutureInterfaceBase *this,function<void_(const_QFutureInterfaceBase_&)> *func,
          QFutureInterfaceBasePrivate *continuationFutureData)

{
  long lVar1;
  undefined8 in_RDX;
  ContinuationType type;
  void *in_RSI;
  function<void_(const_QFutureInterfaceBase_&)> *in_RDI;
  long in_FS_OFFSET;
  function<void_(const_QFutureInterfaceBase_&)> *in_stack_ffffffffffffff98;
  QFutureInterfaceBase *in_stack_ffffffffffffffd8;
  
  type = (ContinuationType)((ulong)in_RDX >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::function<void_(const_QFutureInterfaceBase_&)>::function(in_RDI,in_stack_ffffffffffffff98);
  setContinuation(in_stack_ffffffffffffffd8,in_RDI,in_RSI,type);
  std::function<void_(const_QFutureInterfaceBase_&)>::~function
            ((function<void_(const_QFutureInterfaceBase_&)> *)0x1fc583);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFutureInterfaceBase::setContinuation(std::function<void(const QFutureInterfaceBase &)> func,
                                           QFutureInterfaceBasePrivate *continuationFutureData)
{
    // Backwards compatibility - the continuation data was used for
    // then-continuations
    setContinuation(std::move(func), continuationFutureData, ContinuationType::Then);
}